

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::TaggedUnionExpression::fromSyntax
          (Compilation *compilation,TaggedUnionExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view arg;
  string_view arg_00;
  string_view name;
  SourceRange assignmentRange;
  bool bVar1;
  Symbol *pSVar2;
  FieldSymbol *context_00;
  Expression *pEVar3;
  Compilation *in_RCX;
  SourceLocation in_RDX;
  long in_RSI;
  Expression *in_RDI;
  TaggedUnionExpression *result;
  Expression *valueExpr;
  FieldSymbol *field;
  Diagnostic *diag;
  Symbol *member;
  string_view memberName;
  Expression *in_stack_fffffffffffffeb8;
  Compilation *in_stack_fffffffffffffec0;
  Type *in_stack_fffffffffffffec8;
  Token *in_stack_fffffffffffffed0;
  Type *in_stack_fffffffffffffed8;
  SourceLocation in_stack_fffffffffffffee0;
  SourceLocation in_stack_fffffffffffffee8;
  BumpAllocator *in_stack_fffffffffffffef0;
  DiagCode code;
  Diagnostic *in_stack_ffffffffffffff00;
  Type *in_stack_ffffffffffffff08;
  Diagnostic *in_stack_ffffffffffffff10;
  Scope *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  bitmask<slang::ast::ASTFlags> local_c0 [3];
  Expression *local_a8;
  ExpressionSyntax *in_stack_ffffffffffffff68;
  Type *in_stack_ffffffffffffff70;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string_view local_50;
  SourceRange local_40;
  undefined4 local_2c;
  Compilation *local_28;
  undefined8 local_20;
  long local_18;
  Expression *local_10;
  TaggedUnionExpression *local_8;
  
  local_28 = in_RCX;
  if ((in_RCX == (Compilation *)0x0) ||
     (local_20 = in_RDX, local_18 = in_RSI, local_10 = in_RDI,
     bVar1 = Type::isTaggedUnion(in_stack_fffffffffffffec8), !bVar1)) {
    code = SUB84((ulong)in_stack_fffffffffffffef0 >> 0x20,0);
    if ((local_28 == (Compilation *)0x0) || (bVar1 = Type::isError((Type *)0xbb95df), !bVar1)) {
      local_2c = 0x9b0007;
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff10);
      sourceRange.endLoc = in_stack_fffffffffffffee8;
      sourceRange.startLoc = in_stack_fffffffffffffee0;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffed8,code,sourceRange);
    }
    local_8 = (TaggedUnionExpression *)
              Expression::badExpr(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    local_50 = parsing::Token::valueText(in_stack_fffffffffffffed0);
    Type::getCanonicalType((Type *)in_stack_fffffffffffffec0);
    Symbol::as<slang::ast::Scope>((Symbol *)0xbb968f);
    name._M_str = in_stack_ffffffffffffff28;
    name._M_len = in_stack_ffffffffffffff20;
    pSVar2 = Scope::find(in_stack_ffffffffffffff18,name);
    if (pSVar2 == (Symbol *)0x0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_50);
      if (!bVar1) {
        parsing::Token::range((Token *)in_stack_fffffffffffffee0);
        sourceRange_00.endLoc = in_stack_fffffffffffffee8;
        sourceRange_00.startLoc = in_stack_fffffffffffffee0;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffed8,local_20._4_4_,sourceRange_00);
        arg._M_str = (char *)in_stack_ffffffffffffff10;
        arg._M_len = (size_t)in_stack_ffffffffffffff08;
        Diagnostic::operator<<(in_stack_ffffffffffffff00,arg);
        ast::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      local_8 = (TaggedUnionExpression *)
                Expression::badExpr(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    else {
      context_00 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)0xbb97cf);
      local_a8 = (Expression *)0x0;
      if (*(long *)(local_18 + 0x38) == 0) {
        ValueSymbol::getType((ValueSymbol *)0xbb988a);
        bVar1 = Type::isVoid((Type *)0xbb9892);
        if (!bVar1) {
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff10);
          sourceRange_01.endLoc = in_stack_fffffffffffffee8;
          sourceRange_01.startLoc = in_stack_fffffffffffffee0;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffed8,
                              SUB84((ulong)in_stack_fffffffffffffef0 >> 0x20,0),sourceRange_01);
          arg_00._M_str = (char *)in_stack_ffffffffffffff10;
          arg_00._M_len = (size_t)in_stack_ffffffffffffff08;
          Diagnostic::operator<<(in_stack_ffffffffffffff00,arg_00);
          pEVar3 = Expression::badExpr(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          return pEVar3;
        }
      }
      else {
        in_stack_fffffffffffffed8 = ValueSymbol::getType((ValueSymbol *)0xbb9803);
        in_stack_fffffffffffffee0 = *(SourceLocation *)(local_18 + 0x38);
        SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffec0);
        bitmask<slang::ast::ASTFlags>::bitmask(local_c0,None);
        assignmentRange.endLoc._0_4_ = in_stack_ffffffffffffff88;
        assignmentRange.startLoc = (SourceLocation)in_stack_ffffffffffffff80;
        assignmentRange.endLoc._4_4_ = in_stack_ffffffffffffff8c;
        local_a8 = Expression::bindRValue
                             (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,assignmentRange,
                              (ASTContext *)context_00,in_stack_ffffffffffffff78);
        in_stack_fffffffffffffee8 = local_20;
      }
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff10);
      local_8 = BumpAllocator::
                emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
                          (in_stack_fffffffffffffef0,(Type *)in_stack_fffffffffffffee8,
                           (Symbol *)in_stack_fffffffffffffee0,
                           (Expression **)in_stack_fffffffffffffed8,
                           (SourceRange *)in_stack_fffffffffffffed0);
      if ((local_a8 != (Expression *)0x0) &&
         (bVar1 = Expression::bad((Expression *)local_28), bVar1)) {
        local_8 = (TaggedUnionExpression *)Expression::badExpr(local_28,local_10);
      }
    }
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& TaggedUnionExpression::fromSyntax(Compilation& compilation,
                                              const TaggedUnionExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    if (!assignmentTarget || !assignmentTarget->isTaggedUnion()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::TaggedUnionTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto memberName = syntax.member.valueText();
    auto member = assignmentTarget->getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.member.range());
            diag << memberName << *assignmentTarget;
        }
        return badExpr(compilation, nullptr);
    }

    auto& field = member->as<FieldSymbol>();

    const Expression* valueExpr = nullptr;
    if (syntax.expr) {
        valueExpr = &bindRValue(field.getType(), *syntax.expr, {}, context);
    }
    else if (!field.getType().isVoid()) {
        context.addDiag(diag::TaggedUnionMissingInit, syntax.sourceRange()) << field.name;
        return badExpr(compilation, nullptr);
    }

    auto result = compilation.emplace<TaggedUnionExpression>(*assignmentTarget, *member, valueExpr,
                                                             syntax.sourceRange());
    if (valueExpr && valueExpr->bad())
        return badExpr(compilation, result);

    return *result;
}